

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

QRgbaFloat32 *
qt_fetch_linear_gradient_rgbfp
          (QRgbaFloat32 *buffer,Operator *op,QSpanData *data,int y,int x,int length)

{
  QRgbaFloat<float> *pQVar1;
  int in_stack_0000006c;
  int in_stack_00000070;
  int in_stack_00000074;
  QSpanData *in_stack_00000078;
  Operator *in_stack_00000080;
  QRgbaFloat<float> *in_stack_00000088;
  
  pQVar1 = qt_fetch_linear_gradient_template<GradientBaseFP,QRgbaFloat<float>>
                     (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
                      in_stack_00000070,in_stack_0000006c);
  return pQVar1;
}

Assistant:

static const QRgbaFloat32 * QT_FASTCALL qt_fetch_linear_gradient_rgbfp(QRgbaFloat32 *buffer, const Operator *op, const QSpanData *data,
                                                                   int y, int x, int length)
{
    return qt_fetch_linear_gradient_template<GradientBaseFP, QRgbaFloat32>(buffer, op, data, y, x, length);
}